

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  pointer *ppuVar2;
  pointer *ppuVar3;
  pointer *ppuVar4;
  pointer *ppuVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  FileDescriptor *file_00;
  pointer puVar8;
  iterator __position_02;
  _Alloc_hider _Var9;
  FileOptions_OptimizeMode FVar10;
  mapped_type *pmVar11;
  MessageGenerator *pMVar12;
  Options *pOVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  msgs;
  MessageGenerator *msg_gen;
  key_type local_c8;
  undefined1 local_a0 [32];
  Options *local_80;
  key_type local_78;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
  *local_58;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
  *local_50;
  MessageSCCAnalyzer *local_48;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>>>
  *local_40;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>
  *local_38;
  
  p_Var1 = &(this->weak_deps_)._M_t._M_impl.super__Rb_tree_header;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->weak_deps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->file_ = file;
  local_80 = &this->options_;
  Options::Options(local_80,options);
  local_48 = &this->scc_analyzer_;
  MessageSCCAnalyzer::MessageSCCAnalyzer(local_48,options);
  variables = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_38 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>
              *)&this->message_generators_;
  local_50 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
              *)&this->enum_generators_;
  local_40 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>>>
              *)&this->service_generators_;
  local_58 = (vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
              *)&this->extension_generators_;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->message_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetCommonVars(options,variables);
  paVar6 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"dllexport_decl","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_c8);
  std::__cxx11::string::_M_assign((string *)pmVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar6) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  pMVar12 = (MessageGenerator *)(local_a0 + 0x10);
  local_a0._0_8_ = pMVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"TableStruct","");
  UniqueName(&local_c8,(string *)local_a0,*(string **)this->file_,local_80);
  paVar7 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"tablename","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar7) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar6) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((MessageGenerator *)local_a0._0_8_ != pMVar12) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_a0._0_8_ = pMVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"file_level_metadata","");
  pOVar13 = local_80;
  UniqueName(&local_c8,(string *)local_a0,*(string **)this->file_,local_80);
  local_78._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"file_level_metadata","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar7) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar6) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((MessageGenerator *)local_a0._0_8_ != pMVar12) {
    operator_delete((void *)local_a0._0_8_);
  }
  DescriptorTableName_abi_cxx11_(&local_c8,(cpp *)this->file_,(FileDescriptor *)local_80,pOVar13);
  local_a0._0_8_ = pMVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"desc_table","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_a0);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_c8);
  if ((MessageGenerator *)local_a0._0_8_ != pMVar12) {
    operator_delete((void *)local_a0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar6) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_a0._0_8_ = pMVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"file_level_enum_descriptors","");
  UniqueName(&local_c8,(string *)local_a0,*(string **)this->file_,local_80);
  local_78._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"file_level_enum_descriptors","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar7) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar6) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((MessageGenerator *)local_a0._0_8_ != pMVar12) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_a0._0_8_ = pMVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"file_level_service_descriptors","");
  pOVar13 = local_80;
  UniqueName(&local_c8,(string *)local_a0,*(string **)this->file_,local_80);
  local_78._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"file_level_service_descriptors","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar7) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar6) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((MessageGenerator *)local_a0._0_8_ != pMVar12) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"filename","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_c8);
  std::__cxx11::string::_M_assign((string *)pmVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar6) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  Namespace_abi_cxx11_(&local_c8,(cpp *)this->file_,(FileDescriptor *)options,pOVar13);
  local_a0._0_8_ = pMVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"package_ns","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_a0);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_c8);
  if ((MessageGenerator *)local_a0._0_8_ != pMVar12) {
    operator_delete((void *)local_a0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar6) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  FlattenMessagesInFile
            (file,(vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)&local_c8);
  if ((pointer)local_c8._M_string_length != local_c8._M_dataplus._M_p) {
    uVar15 = 0;
    do {
      _Var9._M_p = local_c8._M_dataplus._M_p;
      pMVar12 = (MessageGenerator *)operator_new(0x220);
      MessageGenerator::MessageGenerator
                (pMVar12,*(Descriptor **)(_Var9._M_p + uVar15 * 8),variables,(int)uVar15,options,
                 local_48);
      __position._M_current =
           (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a0._0_8_ = pMVar12;
      if (__position._M_current ==
          (this->message_generators_).
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::MessageGenerator*&>
                  (local_38,__position,(MessageGenerator **)local_a0);
      }
      else {
        ((__position._M_current)->_M_t).
        super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>.
        _M_head_impl = pMVar12;
        ppuVar2 = &(this->message_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + 1;
      }
      MessageGenerator::AddGenerators
                ((MessageGenerator *)local_a0._0_8_,
                 (vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                  *)local_50,
                 (vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                  *)local_58);
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p) >>
                             3));
  }
  if (0 < *(int *)(file + 0x30)) {
    lVar14 = 0;
    lVar16 = 0;
    do {
      pMVar12 = (MessageGenerator *)operator_new(0x68);
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)pMVar12,(EnumDescriptor *)(*(long *)(file + 0x60) + lVar14),
                 variables,options);
      __position_00._M_current =
           (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a0._0_8_ = pMVar12;
      if (__position_00._M_current ==
          (this->enum_generators_).
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::EnumGenerator*>
                  (local_50,__position_00,(EnumGenerator **)local_a0);
      }
      else {
        ((__position_00._M_current)->_M_t).
        super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>._M_head_impl
             = (EnumGenerator *)pMVar12;
        ppuVar3 = &(this->enum_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar3 = *ppuVar3 + 1;
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x48;
    } while (lVar16 < *(int *)(file + 0x30));
  }
  if (0 < *(int *)(file + 0x34)) {
    lVar14 = 0;
    lVar16 = 0;
    do {
      pMVar12 = (MessageGenerator *)operator_new(0x48);
      ServiceGenerator::ServiceGenerator
                ((ServiceGenerator *)pMVar12,(ServiceDescriptor *)(*(long *)(file + 0x68) + lVar14),
                 variables,options);
      __position_01._M_current =
           (this->service_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a0._0_8_ = pMVar12;
      if (__position_01._M_current ==
          (this->service_generators_).
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ServiceGenerator*>
                  (local_40,__position_01,(ServiceGenerator **)local_a0);
      }
      else {
        ((__position_01._M_current)->_M_t).
        super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ServiceGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::cpp::ServiceGenerator_*,_false>.
        _M_head_impl = (ServiceGenerator *)pMVar12;
        ppuVar4 = &(this->service_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar4 = *ppuVar4 + 1;
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x30;
    } while (lVar16 < *(int *)(file + 0x34));
  }
  file_00 = this->file_;
  if (0 < *(int *)(file_00 + 0x34)) {
    FVar10 = GetOptimizeFor(file_00,local_80,(bool *)0x0);
    if ((FVar10 != FileOptions_OptimizeMode_LITE_RUNTIME) &&
       (*(char *)(*(long *)(file_00 + 0x78) + 0x9b) == '\x01')) {
      puVar8 = (this->service_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = (long)(this->service_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
      if (lVar14 != 0) {
        lVar14 = lVar14 >> 3;
        lVar16 = 0;
        do {
          *(int *)((long)puVar8[lVar16]._M_t.
                         super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                         ._M_t + 0x40) = (int)lVar16;
          lVar16 = lVar16 + 1;
        } while (lVar14 + (ulong)(lVar14 == 0) != lVar16);
      }
    }
  }
  if (0 < *(int *)(file + 0x3c)) {
    lVar14 = 0;
    lVar16 = 0;
    do {
      pMVar12 = (MessageGenerator *)operator_new(0x150);
      ExtensionGenerator::ExtensionGenerator
                ((ExtensionGenerator *)pMVar12,(FieldDescriptor *)(*(long *)(file + 0x70) + lVar14),
                 options,local_48);
      __position_02._M_current =
           (this->extension_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a0._0_8_ = pMVar12;
      if (__position_02._M_current ==
          (this->extension_generators_).
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ExtensionGenerator*>
                  (local_58,__position_02,(ExtensionGenerator **)local_a0);
      }
      else {
        ((__position_02._M_current)->_M_t).
        super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>.
        _M_head_impl = (ExtensionGenerator *)pMVar12;
        ppuVar5 = &(this->extension_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar5 = *ppuVar5 + 1;
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x48;
    } while (lVar16 < *(int *)(file + 0x3c));
  }
  if (0 < *(int *)(file + 0x28)) {
    lVar14 = 0;
    do {
      local_a0._0_8_ =
           FileDescriptor::dependency(file,*(int *)(*(long *)(file + 0x50) + lVar14 * 4));
      std::
      _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
      ::_M_insert_unique<google::protobuf::FileDescriptor_const*>
                ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                  *)this,(FileDescriptor **)local_a0);
      lVar14 = lVar14 + 1;
    } while (lVar14 < *(int *)(file + 0x28));
  }
  if (local_c8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options)
    : file_(file), options_(options), scc_analyzer_(options) {
  // These variables are the same on a file level
  SetCommonVars(options, &variables_);
  variables_["dllexport_decl"] = options.dllexport_decl;
  variables_["tablename"] = UniqueName("TableStruct", file_, options_);
  variables_["file_level_metadata"] =
      UniqueName("file_level_metadata", file_, options_);
  variables_["desc_table"] = DescriptorTableName(file_, options_);
  variables_["file_level_enum_descriptors"] =
      UniqueName("file_level_enum_descriptors", file_, options_);
  variables_["file_level_service_descriptors"] =
      UniqueName("file_level_service_descriptors", file_, options_);
  variables_["filename"] = file_->name();
  variables_["package_ns"] = Namespace(file_, options);

  std::vector<const Descriptor*> msgs = FlattenMessagesInFile(file);
  for (int i = 0; i < msgs.size(); i++) {
    // Deleted in destructor
    MessageGenerator* msg_gen =
        new MessageGenerator(msgs[i], variables_, i, options, &scc_analyzer_);
    message_generators_.emplace_back(msg_gen);
    msg_gen->AddGenerators(&enum_generators_, &extension_generators_);
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_.emplace_back(
        new EnumGenerator(file->enum_type(i), variables_, options));
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_.emplace_back(
        new ServiceGenerator(file->service(i), variables_, options));
  }
  if (HasGenericServices(file_, options_)) {
    for (int i = 0; i < service_generators_.size(); i++) {
      service_generators_[i]->index_in_metadata_ = i;
    }
  }
  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_.emplace_back(
        new ExtensionGenerator(file->extension(i), options, &scc_analyzer_));
  }
  for (int i = 0; i < file->weak_dependency_count(); ++i) {
    weak_deps_.insert(file->weak_dependency(i));
  }
}